

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

int __thiscall llvm::APInt::compare(APInt *this,APInt *RHS)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = this->BitWidth;
  if (uVar1 != RHS->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be same for comparison\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x113,"int llvm::APInt::compare(const APInt &) const");
  }
  if (uVar1 < 0x41) {
    uVar1 = 0xffffffff;
    if ((RHS->U).VAL <= (this->U).VAL) {
      uVar1 = (uint)((RHS->U).VAL < (this->U).VAL);
    }
  }
  else {
    uVar2 = (ulong)uVar1 + 0x3f >> 6;
    do {
      bVar3 = uVar2 == 0;
      uVar2 = uVar2 - 1;
      if (bVar3) {
        return 0;
      }
    } while ((this->U).pVal[uVar2] == (RHS->U).pVal[uVar2]);
    uVar1 = ((RHS->U).pVal[uVar2] < (this->U).pVal[uVar2]) - 1 | 1;
  }
  return uVar1;
}

Assistant:

int APInt::compare(const APInt& RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be same for comparison");
  if (isSingleWord())
    return U.VAL < RHS.U.VAL ? -1 : U.VAL > RHS.U.VAL;

  return tcCompare(U.pVal, RHS.U.pVal, getNumWords());
}